

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall adios2::IO::SetParameters(IO *this,Params *parameters)

{
  undefined8 *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to IO::SetParameters",&local_31);
  helper::CheckForNullptr<adios2::core::IO>((IO *)this,(string *)parameters);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  adios2::core::IO::SetParameters((map *)*in_RDI);
  return;
}

Assistant:

void IO::SetParameters(const Params &parameters)
{
    helper::CheckForNullptr(m_IO, "in call to IO::SetParameters");
    m_IO->SetParameters(parameters);
}